

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O2

void xml_print_list(lyout *out,int level,lyd_node *node,int is_list,int toplevel,int options)

{
  lyd_node *node_00;
  int iVar1;
  lys_module *plVar2;
  ulong uVar3;
  char *pcVar4;
  lyd_node **pplVar5;
  
  if (is_list == 0) {
    xml_print_leaf(out,level,node,toplevel,options);
    return;
  }
  if (toplevel == 0) {
    if (node->parent != (lyd_node *)0x0) {
      iVar1 = nscmp(node,node->parent);
      if (iVar1 == 0) {
        uVar3 = (ulong)(level * 2 - 2);
        if (level == 0) {
          uVar3 = 0;
        }
        ly_print(out,"%*s<%s",uVar3,"",node->schema->name);
        goto LAB_00176f8b;
      }
    }
    plVar2 = lyd_node_module(node);
    uVar3 = (ulong)(level * 2 - 2);
    if (level == 0) {
      uVar3 = 0;
    }
    ly_print(out,"%*s<%s xmlns=\"%s\"",uVar3,"",node->schema->name,plVar2->ns);
  }
  else {
    plVar2 = lyd_node_module(node);
    uVar3 = (ulong)(level * 2 - 2);
    if (level == 0) {
      uVar3 = 0;
    }
    ly_print(out,"%*s<%s xmlns=\"%s\"",uVar3,"",node->schema->name,plVar2->ns);
    xml_print_ns(out,node,options);
  }
LAB_00176f8b:
  xml_print_attrs(out,node,options);
  pcVar4 = "\n";
  if (level == 0) {
    pcVar4 = "";
  }
  if (node->child != (lyd_node *)0x0) {
    pplVar5 = &node->child;
    ly_print(out,">%s");
    iVar1 = level + 1;
    if (level == 0) {
      iVar1 = 0;
    }
    while (node_00 = *pplVar5, node_00 != (lyd_node *)0x0) {
      xml_print_node(out,iVar1,node_00,0,options);
      pplVar5 = &node_00->next;
    }
    uVar3 = (ulong)(level * 2 - 2);
    if (level == 0) {
      uVar3 = 0;
    }
    ly_print(out,"%*s</%s>%s",uVar3,"",node->schema->name,pcVar4);
    return;
  }
  ly_print(out,"/>%s");
  return;
}

Assistant:

static void
xml_print_list(struct lyout *out, int level, const struct lyd_node *node, int is_list, int toplevel, int options)
{
    struct lyd_node *child;
    const char *ns;

    if (is_list) {
        /* list print */
        if (toplevel || !node->parent || nscmp(node, node->parent)) {
            /* print "namespace" */
            ns = lyd_node_module(node)->ns;
            ly_print(out, "%*s<%s xmlns=\"%s\"", LEVEL, INDENT, node->schema->name, ns);
        } else {
            ly_print(out, "%*s<%s", LEVEL, INDENT, node->schema->name);
        }

        if (toplevel) {
            xml_print_ns(out, node, options);
        }
        xml_print_attrs(out, node, options);

        if (!node->child) {
            ly_print(out, "/>%s", level ? "\n" : "");
            return;
        }
        ly_print(out, ">%s", level ? "\n" : "");

        LY_TREE_FOR(node->child, child) {
            xml_print_node(out, level ? level + 1 : 0, child, 0, options);
        }

        ly_print(out, "%*s</%s>%s", LEVEL, INDENT, node->schema->name, level ? "\n" : "");
    } else {
        /* leaf-list print */
        xml_print_leaf(out, level, node, toplevel, options);
    }
}